

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

ssize_t rw::Texture::read(int __fd,void *__buf,size_t __nbytes)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  long lVar3;
  Texture *pTVar4;
  Raster *pRVar5;
  TexDictionary *pTVar6;
  undefined4 in_register_0000003c;
  
  lVar3 = (*(code *)findCB)();
  if (lVar3 != 0) {
    *(int *)(lVar3 + 100) = *(int *)(lVar3 + 100) + 1;
    return lVar3;
  }
  lVar3 = (long)textureModuleOffset;
  if (*(int *)(engine + 0x10 + lVar3) != 0) {
    pTVar4 = (Texture *)(*(code *)readCB)((char *)CONCAT44(in_register_0000003c,__fd),__buf);
    if (pTVar4 != (Texture *)0x0) goto LAB_00111fa0;
    lVar3 = (long)textureModuleOffset;
  }
  if (*(int *)(engine + 0x14 + lVar3) == 0) {
    return 0;
  }
  pTVar4 = create((Raster *)0x0);
  if (pTVar4 == (Texture *)0x0) {
    return 0;
  }
  strncpy(pTVar4->name,(char *)CONCAT44(in_register_0000003c,__fd),0x20);
  if (__buf != (void *)0x0) {
    strncpy(pTVar4->mask,(char *)__buf,0x20);
  }
  pRVar5 = Raster::create(0,0,0,0x80,0);
  pTVar4->raster = pRVar5;
LAB_00111fa0:
  lVar3 = (long)textureModuleOffset;
  pTVar6 = *(TexDictionary **)(engine + 8 + lVar3);
  if (pTVar6 != (TexDictionary *)0x0) {
    if (pTVar4->dict != (TexDictionary *)0x0) {
      pLVar1 = (pTVar4->inDict).next;
      pLVar2 = (pTVar4->inDict).prev;
      pLVar2->next = pLVar1;
      pTVar6 = *(TexDictionary **)(engine + 8 + lVar3);
      pLVar1->prev = pLVar2;
    }
    pTVar4->dict = pTVar6;
    (pTVar4->inDict).next = &(pTVar6->textures).link;
    pLVar1 = (pTVar6->textures).link.prev;
    (pTVar4->inDict).prev = pLVar1;
    pLVar1->next = &pTVar4->inDict;
    (pTVar6->textures).link.prev = &pTVar4->inDict;
  }
  return (ssize_t)pTVar4;
}

Assistant:

Texture*
Texture::read(const char *name, const char *mask)
{
	(void)mask;
	Raster *raster = nil;
	Texture *tex;

	if(tex = Texture::findCB(name), tex){
		tex->addRef();
		return tex;
	}
	if(TEXTUREGLOBAL(loadTextures)){
		tex = Texture::readCB(name, mask);
		if(tex == nil)
			goto dummytex;
	}else dummytex: if(TEXTUREGLOBAL(makeDummies)){
//printf("missing texture %s %s\n", name ? name : "", mask ? mask : "");
		tex = Texture::create(nil);
		if(tex == nil)
			return nil;
		strncpy(tex->name, name, 32);
		if(mask)
			strncpy(tex->mask, mask, 32);
		raster = Raster::create(0, 0, 0, Raster::DONTALLOCATE);
		tex->raster = raster;
	}
	if(tex && TEXTUREGLOBAL(currentTexDict)){
		if(tex->dict)
			tex->inDict.remove();
		TEXTUREGLOBAL(currentTexDict)->add(tex);
	}
	return tex;
}